

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTreeTest.cc
# Opt level: O0

void run_randomized_test(void)

{
  size_t *psVar1;
  long lVar2;
  FILE *pFVar3;
  bool bVar4;
  int iVar5;
  time_t tVar6;
  size_type sVar7;
  size_t sVar8;
  size_t sVar9;
  pair<phosg::Vector2<long>,_long> *ppVar10;
  pair<phosg::Vector2<long>,_long> *ppVar11;
  ulong uVar12;
  pair<long,_long> pVar13;
  pair<std::_Rb_tree_const_iterator<std::pair<long,_long>_>,_bool> pVar14;
  bool local_631;
  Vector2<long> local_5d8;
  Vector2<long> local_5c8;
  Vector2<long> local_5b8;
  Vector2<long> local_5a8;
  pair<long,_long> local_598;
  long lStack_588;
  pair<phosg::Vector2<long>,_long> it_5;
  Iterator __end1_3;
  Iterator __begin1_3;
  KDTree<phosg::Vector2<long>,_long> *__range1_3;
  long local_490;
  Iterator local_488;
  undefined1 local_420 [8];
  Iterator it_4;
  long lStack_3a8;
  pair<phosg::Vector2<long>,_long> it_3;
  undefined1 local_388 [8];
  Iterator __end1_2;
  Iterator __begin1_2;
  KDTree<phosg::Vector2<long>,_long> *__range1_2;
  long local_2a8;
  Iterator local_2a0;
  undefined1 local_238 [8];
  Iterator it_2;
  pair<long,_long> *it_1;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  *__range1_1;
  long local_1a8;
  reference local_1a0;
  pair<phosg::Vector2<long>,_long> *it;
  iterator __end1;
  iterator __begin1;
  Vector2<long> local_178;
  vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  local_168;
  vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  *local_150;
  vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  *__range1;
  set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  remaining_points;
  Vector2<long> local_110;
  Iterator local_100;
  _Base_ptr local_98;
  undefined1 local_90;
  pair<long,_long> local_78;
  _Base_ptr local_68;
  undefined1 local_60;
  long local_58;
  int64_t y;
  int64_t x;
  set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  points;
  KDTree<phosg::Vector2<long>,_long> t;
  
  printf("-- randomized\n");
  printf("--   construction/insert\n");
  tVar6 = time((time_t *)0x0);
  srand((uint)tVar6);
  phosg::KDTree<phosg::Vector2<long>,_long>::KDTree
            ((KDTree<phosg::Vector2<long>,_long> *)
             &points._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  ::set((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
         *)&x);
  while( true ) {
    sVar7 = std::
            set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
            ::size((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                    *)&x);
    pFVar3 = _stderr;
    if (999 < sVar7) break;
    iVar5 = rand();
    y = (int64_t)(iVar5 % 1000);
    iVar5 = rand();
    local_58 = (long)(iVar5 % 1000);
    pVar13 = std::make_pair<long&,long&>(&y,&local_58);
    local_78 = pVar13;
    pVar14 = std::
             set<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
             ::emplace<std::pair<long,long>>
                       ((set<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                         *)&x,&local_78);
    local_98 = (_Base_ptr)pVar14.first._M_node;
    local_90 = pVar14.second;
    local_68 = local_98;
    local_60 = local_90;
    if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      phosg::Vector2<long>::Vector2(&local_110,y,local_58);
      remaining_points._M_t._M_impl.super__Rb_tree_header._M_node_count = y * local_58;
      phosg::KDTree<phosg::Vector2<long>,_long>::insert
                (&local_100,
                 (KDTree<phosg::Vector2<long>,_long> *)
                 &points._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_110,
                 (long *)&remaining_points._M_t._M_impl.super__Rb_tree_header._M_node_count);
      phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator(&local_100);
    }
  }
  sVar8 = phosg::KDTree<phosg::Vector2<long>,_long>::size
                    ((KDTree<phosg::Vector2<long>,_long> *)
                     &points._M_t._M_impl.super__Rb_tree_header._M_node_count);
  sVar9 = phosg::KDTree<phosg::Vector2<long>,_long>::depth
                    ((KDTree<phosg::Vector2<long>,_long> *)
                     &points._M_t._M_impl.super__Rb_tree_header._M_node_count);
  fprintf(pFVar3,"--     tree: size=%zu, depth=%zu\n",sVar8,sVar9);
  printf("--   within\n");
  std::
  set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  ::set((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
         *)&__range1,
        (set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
         *)&x);
  phosg::Vector2<long>::Vector2(&local_178,0xfa,0xfa);
  phosg::Vector2<long>::Vector2((Vector2<long> *)&__begin1,0x2ee,0x2ee);
  phosg::KDTree<phosg::Vector2<long>,_long>::within
            (&local_168,
             (KDTree<phosg::Vector2<long>,_long> *)
             &points._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_178,
             (Vector2<long> *)&__begin1);
  local_150 = &local_168;
  __end1 = std::
           vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
           ::begin(local_150);
  it = (pair<phosg::Vector2<long>,_long> *)
       std::
       vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
       ::end(local_150);
  while( true ) {
    bVar4 = __gnu_cxx::
            operator==<std::pair<phosg::Vector2<long>,_long>_*,_std::vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>_>
                      (&__end1,(__normal_iterator<std::pair<phosg::Vector2<long>,_long>_*,_std::vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>_>
                                *)&it);
    if (((bVar4 ^ 0xffU) & 1) == 0) break;
    local_1a0 = __gnu_cxx::
                __normal_iterator<std::pair<phosg::Vector2<long>,_long>_*,_std::vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>_>
                ::operator*(&__end1);
    phosg::expect_generic
              (0xf9 < (local_1a0->first).field_0.x,"it.first.x < 250",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x24);
    phosg::expect_generic
              ((local_1a0->first).field_0.x < 0x2ee,"it.first.x >= 750",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x25);
    phosg::expect_generic
              (0xf9 < (local_1a0->first).field_1.y,"it.first.y < 250",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x26);
    phosg::expect_generic
              ((local_1a0->first).field_1.y < 0x2ee,"it.first.y >= 750",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x27);
    pVar13 = std::make_pair<long_const&,long_const&>
                       ((long *)local_1a0,&(local_1a0->first).field_1.y);
    local_1a8 = pVar13.second;
    __range1_1 = (set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                  *)pVar13.first;
    sVar7 = std::
            set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
            ::erase((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                     *)&__range1,(key_type *)&__range1_1);
    phosg::expect_generic
              (sVar7 == 1,"1 != remaining_points.erase(make_pair(it.first.x, it.first.y))",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x28);
    __gnu_cxx::
    __normal_iterator<std::pair<phosg::Vector2<long>,_long>_*,_std::vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  ::~vector(&local_168);
  __end1_1 = std::
             set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
             ::begin((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                      *)&__range1);
  it_1 = (pair<long,_long> *)
         std::
         set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
         ::end((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                *)&__range1);
  while( true ) {
    bVar4 = std::operator==(&__end1_1,(_Self *)&it_1);
    if (((bVar4 ^ 0xffU) & 1) == 0) break;
    it_2.current.second =
         (long)std::_Rb_tree_const_iterator<std::pair<long,_long>_>::operator*(&__end1_1);
    local_631 = true;
    if (((0xf9 < ((reference)it_2.current.second)->first) &&
        (local_631 = true, ((reference)it_2.current.second)->first < 0x2ee)) &&
       (local_631 = true, 0xf9 < ((reference)it_2.current.second)->second)) {
      local_631 = 0x2ed < ((reference)it_2.current.second)->second;
    }
    phosg::expect_generic
              (local_631,
               "!((it.first < 250) || (it.first >= 750) || (it.second < 250) || (it.second >= 750))"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x2b);
    std::_Rb_tree_const_iterator<std::pair<long,_long>_>::operator++(&__end1_1);
  }
  std::
  set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  ::~set((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
          *)&__range1);
  printf("--   erase 1\n");
  phosg::KDTree<phosg::Vector2<long>,_long>::begin
            ((Iterator *)local_238,
             (KDTree<phosg::Vector2<long>,_long> *)
             &points._M_t._M_impl.super__Rb_tree_header._M_node_count);
  while( true ) {
    phosg::KDTree<phosg::Vector2<long>,_long>::end
              (&local_2a0,
               (KDTree<phosg::Vector2<long>,_long> *)
               &points._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar4 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator!=
                      ((Iterator *)local_238,&local_2a0);
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator(&local_2a0);
    if (!bVar4) break;
    ppVar11 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator->((Iterator *)local_238)
    ;
    ppVar10 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator->((Iterator *)local_238)
    ;
    pVar13 = std::make_pair<long_const&,long_const&>((long *)ppVar11,&(ppVar10->first).field_1.y);
    local_2a8 = pVar13.second;
    __range1_2 = (KDTree<phosg::Vector2<long>,_long> *)pVar13.first;
    sVar7 = std::
            set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
            ::count((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                     *)&x,(key_type *)&__range1_2);
    phosg::expect_generic
              (sVar7 == 1,"1 != points.count(make_pair(it->first.x, it->first.y))",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x33);
    ppVar11 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator->((Iterator *)local_238)
    ;
    lVar2 = (ppVar11->first).field_0.x;
    ppVar11 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator->((Iterator *)local_238)
    ;
    if ((lVar2 + (ppVar11->first).field_1.y) % 2 == 0) {
      phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++((Iterator *)local_238);
    }
    else {
      phosg::KDTree<phosg::Vector2<long>,_long>::erase_advance
                ((KDTree<phosg::Vector2<long>,_long> *)
                 &points._M_t._M_impl.super__Rb_tree_header._M_node_count,(Iterator *)local_238);
    }
  }
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator((Iterator *)local_238);
  pFVar3 = _stderr;
  sVar8 = phosg::KDTree<phosg::Vector2<long>,_long>::size
                    ((KDTree<phosg::Vector2<long>,_long> *)
                     &points._M_t._M_impl.super__Rb_tree_header._M_node_count);
  sVar9 = phosg::KDTree<phosg::Vector2<long>,_long>::depth
                    ((KDTree<phosg::Vector2<long>,_long> *)
                     &points._M_t._M_impl.super__Rb_tree_header._M_node_count);
  fprintf(pFVar3,"--     tree: size=%zu, depth=%zu\n",sVar8,sVar9);
  psVar1 = &points._M_t._M_impl.super__Rb_tree_header._M_node_count;
  phosg::KDTree<phosg::Vector2<long>,_long>::begin
            ((Iterator *)&__end1_2.current.second,(KDTree<phosg::Vector2<long>,_long> *)psVar1);
  phosg::KDTree<phosg::Vector2<long>,_long>::end
            ((Iterator *)local_388,(KDTree<phosg::Vector2<long>,_long> *)psVar1);
  while( true ) {
    bVar4 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator!=
                      ((Iterator *)&__end1_2.current.second,(Iterator *)local_388);
    if (!bVar4) break;
    ppVar11 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator*
                        ((Iterator *)&__end1_2.current.second);
    it_3.first.field_1 = (anon_union_8_2_94730038_for_Vector2<long>_3)ppVar11->second;
    lStack_3a8 = (ppVar11->first).field_0.x;
    it_3.first.field_0 = *(anon_union_8_2_94730018_for_Vector2<long>_1 *)&(ppVar11->first).field_1;
    pVar13 = std::make_pair<long&,long&>(&lStack_3a8,(long *)&it_3);
    it_4.current.second = pVar13.first;
    sVar7 = std::
            set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
            ::count((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                     *)&x,(key_type *)&it_4.current.second);
    phosg::expect_generic
              (sVar7 == 1,"1 != points.count(make_pair(it.first.x, it.first.y))",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x3c);
    uVar12 = lStack_3a8 + it_3.first.field_0.x;
    phosg::expect_generic
              (uVar12 == (uVar12 - ((long)uVar12 >> 0x3f) & 0xfffffffffffffffe),
               "0 != (it.first.x + it.first.y) % 2",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x3d);
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++
              ((Iterator *)&__end1_2.current.second);
  }
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator((Iterator *)local_388);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator
            ((Iterator *)&__end1_2.current.second);
  printf("--   erase 2\n");
  phosg::KDTree<phosg::Vector2<long>,_long>::begin
            ((Iterator *)local_420,
             (KDTree<phosg::Vector2<long>,_long> *)
             &points._M_t._M_impl.super__Rb_tree_header._M_node_count);
LAB_00108418:
  do {
    phosg::KDTree<phosg::Vector2<long>,_long>::end
              (&local_488,
               (KDTree<phosg::Vector2<long>,_long> *)
               &points._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar4 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator!=
                      ((Iterator *)local_420,&local_488);
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator(&local_488);
    if (!bVar4) {
      phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator((Iterator *)local_420);
      pFVar3 = _stderr;
      sVar8 = phosg::KDTree<phosg::Vector2<long>,_long>::size
                        ((KDTree<phosg::Vector2<long>,_long> *)
                         &points._M_t._M_impl.super__Rb_tree_header._M_node_count);
      sVar9 = phosg::KDTree<phosg::Vector2<long>,_long>::depth
                        ((KDTree<phosg::Vector2<long>,_long> *)
                         &points._M_t._M_impl.super__Rb_tree_header._M_node_count);
      fprintf(pFVar3,"--     tree: size=%zu, depth=%zu\n",sVar8,sVar9);
      psVar1 = &points._M_t._M_impl.super__Rb_tree_header._M_node_count;
      phosg::KDTree<phosg::Vector2<long>,_long>::begin
                ((Iterator *)&__end1_3.current.second,(KDTree<phosg::Vector2<long>,_long> *)psVar1);
      phosg::KDTree<phosg::Vector2<long>,_long>::end
                ((Iterator *)&it_5.second,(KDTree<phosg::Vector2<long>,_long> *)psVar1);
      while( true ) {
        bVar4 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator!=
                          ((Iterator *)&__end1_3.current.second,(Iterator *)&it_5.second);
        if (!bVar4) break;
        ppVar11 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator*
                            ((Iterator *)&__end1_3.current.second);
        it_5.first.field_1 = (anon_union_8_2_94730038_for_Vector2<long>_3)ppVar11->second;
        lStack_588 = (ppVar11->first).field_0.x;
        it_5.first.field_0 =
             *(anon_union_8_2_94730018_for_Vector2<long>_1 *)&(ppVar11->first).field_1;
        pVar13 = std::make_pair<long&,long&>(&lStack_588,(long *)&it_5);
        local_598 = pVar13;
        sVar7 = std::
                set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                ::count((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                         *)&x,&local_598);
        phosg::expect_generic
                  (sVar7 == 1,"1 != points.count(make_pair(it.first.x, it.first.y))",
                   "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
                   ,0x4f);
        uVar12 = lStack_588 + it_5.first.field_0.x;
        phosg::expect_generic
                  (uVar12 == (uVar12 - ((long)uVar12 >> 0x3f) & 0xfffffffffffffffe),
                   "0 != (it.first.x + it.first.y) % 2",
                   "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
                   ,0x50);
        phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++
                  ((Iterator *)&__end1_3.current.second);
      }
      phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator((Iterator *)&it_5.second);
      phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator
                ((Iterator *)&__end1_3.current.second);
      phosg::Vector2<long>::Vector2(&local_5a8,0xfa,0xfa);
      phosg::Vector2<long>::Vector2(&local_5b8,0x2ee,0x2ee);
      bVar4 = phosg::KDTree<phosg::Vector2<long>,_long>::exists
                        ((KDTree<phosg::Vector2<long>,_long> *)
                         &points._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_5a8,
                         &local_5b8);
      phosg::expect_generic
                ((bool)(~bVar4 & 1),"false != t.exists({250, 250}, {750, 750})",
                 "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
                 ,0x54);
      phosg::Vector2<long>::Vector2(&local_5c8,0,0);
      phosg::Vector2<long>::Vector2(&local_5d8,1000,1000);
      bVar4 = phosg::KDTree<phosg::Vector2<long>,_long>::exists
                        ((KDTree<phosg::Vector2<long>,_long> *)
                         &points._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_5c8,
                         &local_5d8);
      phosg::expect_generic
                (bVar4,"true != t.exists({0, 0}, {1000, 1000})",
                 "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
                 ,0x55);
      std::
      set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
      ::~set((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
              *)&x);
      phosg::KDTree<phosg::Vector2<long>,_long>::~KDTree
                ((KDTree<phosg::Vector2<long>,_long> *)
                 &points._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return;
    }
    ppVar11 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator->((Iterator *)local_420)
    ;
    ppVar10 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator->((Iterator *)local_420)
    ;
    pVar13 = std::make_pair<long_const&,long_const&>((long *)ppVar11,&(ppVar10->first).field_1.y);
    local_490 = pVar13.second;
    __range1_3 = (KDTree<phosg::Vector2<long>,_long> *)pVar13.first;
    sVar7 = std::
            set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
            ::count((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                     *)&x,(key_type *)&__range1_3);
    phosg::expect_generic
              (sVar7 == 1,"1 != points.count(make_pair(it->first.x, it->first.y))",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x45);
    ppVar11 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator->((Iterator *)local_420)
    ;
    if (0xf9 < (ppVar11->first).field_0.x) {
      ppVar11 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator->
                          ((Iterator *)local_420);
      if (0xf9 < (ppVar11->first).field_1.y) {
        ppVar11 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator->
                            ((Iterator *)local_420);
        if ((ppVar11->first).field_0.x < 0x2ee) {
          ppVar11 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator->
                              ((Iterator *)local_420);
          if ((ppVar11->first).field_1.y < 0x2ee) {
            phosg::KDTree<phosg::Vector2<long>,_long>::erase_advance
                      ((KDTree<phosg::Vector2<long>,_long> *)
                       &points._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (Iterator *)local_420);
            goto LAB_00108418;
          }
        }
      }
    }
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++((Iterator *)local_420);
  } while( true );
}

Assistant:

void run_randomized_test() {
  printf("-- randomized\n");

  printf("--   construction/insert\n");
  srand(time(nullptr));
  KDTree<Vector2<int64_t>, int64_t> t;
  set<pair<int64_t, int64_t>> points;
  while (points.size() < 1000) {
    int64_t x = rand() % 1000;
    int64_t y = rand() % 1000;
    if (points.emplace(make_pair(x, y)).second) {
      t.insert({x, y}, x * y);
    }
  }
  fprintf(stderr, "--     tree: size=%zu, depth=%zu\n", t.size(), t.depth());

  printf("--   within\n");
  {
    set<pair<int64_t, int64_t>> remaining_points = points;
    for (const auto& it : t.within({250, 250}, {750, 750})) {
      expect_ge(it.first.x, 250);
      expect_lt(it.first.x, 750);
      expect_ge(it.first.y, 250);
      expect_lt(it.first.y, 750);
      expect_eq(1, remaining_points.erase(make_pair(it.first.x, it.first.y)));
    }
    for (const auto& it : remaining_points) {
      expect((it.first < 250) || (it.first >= 750) || (it.second < 250) || (it.second >= 750));
    }
  }

  printf("--   erase 1\n");
  {
    // delete all points where x + y is an odd number
    for (auto it = t.begin(); it != t.end();) {
      expect_eq(1, points.count(make_pair(it->first.x, it->first.y)));
      if ((it->first.x + it->first.y) % 2) {
        t.erase_advance(it);
      } else {
        ++it;
      }
    }
    fprintf(stderr, "--     tree: size=%zu, depth=%zu\n", t.size(), t.depth());
    for (auto it : t) {
      expect_eq(1, points.count(make_pair(it.first.x, it.first.y)));
      expect_eq(0, (it.first.x + it.first.y) % 2);
    }
  }

  printf("--   erase 2\n");
  {
    // delete all points in (250, 250) -> (750, 750)
    for (auto it = t.begin(); it != t.end();) {
      expect_eq(1, points.count(make_pair(it->first.x, it->first.y)));
      if ((it->first.x >= 250) && (it->first.y >= 250) &&
          (it->first.x < 750) && (it->first.y < 750)) {
        t.erase_advance(it);
      } else {
        ++it;
      }
    }
    fprintf(stderr, "--     tree: size=%zu, depth=%zu\n", t.size(), t.depth());
    for (auto it : t) {
      expect_eq(1, points.count(make_pair(it.first.x, it.first.y)));
      expect_eq(0, (it.first.x + it.first.y) % 2);
    }
  }

  expect_eq(false, t.exists({250, 250}, {750, 750}));
  expect_eq(true, t.exists({0, 0}, {1000, 1000}));
}